

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void __thiscall
charls::process_transformed<charls::transform_hp3<unsigned_short>_>::process_transformed
          (process_transformed<charls::transform_hp3<unsigned_short>_> *this,uint8_t *param_2,
          uint8_t *param_3,frame_info *stride,coding_parameters *info,coding_parameters *parameters)

{
  color_transformation cVar1;
  uint uVar2;
  allocator<unsigned_char> local_55 [20];
  allocator<unsigned_short> local_41;
  coding_parameters *local_40;
  coding_parameters *parameters_local;
  frame_info *info_local;
  size_t stride_local;
  process_transformed<charls::transform_hp3<unsigned_short>_> *this_local;
  uint8_t *local_18;
  byte_span source_pixels_local;
  
  local_40 = parameters;
  parameters_local = info;
  info_local = stride;
  stride_local = (size_t)this;
  local_18 = param_2;
  source_pixels_local.data = param_3;
  charls::process_line::process_line(&this->super_process_line);
  (this->super_process_line)._vptr_process_line = (_func_int **)&PTR__process_transformed_0018f6b0;
  this->frame_info_ = (frame_info *)parameters_local;
  this->parameters_ = local_40;
  this->stride_ = (size_t)info_local;
  cVar1 = parameters_local->transformation;
  uVar2 = parameters_local->near_lossless;
  std::allocator<unsigned_short>::allocator(&local_41);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&this->temp_line_,(long)(int)cVar1 * (ulong)uVar2,&local_41);
  std::allocator<unsigned_short>::~allocator(&local_41);
  cVar1 = parameters_local->transformation;
  uVar2 = parameters_local->near_lossless;
  std::allocator<unsigned_char>::allocator(local_55);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buffer_,(long)(int)cVar1 * (ulong)uVar2 * 2,local_55);
  std::allocator<unsigned_char>::~allocator(local_55);
  transform_hp3<unsigned_short>::inverse::inverse
            ((inverse *)&this->field_0x51,(transform_hp3<unsigned_short> *)((long)&this_local + 7));
  (this->raw_pixels_).data = local_18;
  (this->raw_pixels_).size = (size_t)source_pixels_local.data;
  this->mask_ = (1 << ((byte)parameters_local->interleave_mode & 0x1f)) - 1;
  return;
}

Assistant:

process_transformed(byte_span source_pixels, const size_t stride, const frame_info& info,
                        const coding_parameters& parameters, TransformType transform) :
        frame_info_{info},
        parameters_{parameters},
        stride_{stride},
        temp_line_(static_cast<size_t>(info.component_count) * info.width),
        buffer_(static_cast<size_t>(info.component_count) * info.width * sizeof(size_type)),
        transform_{transform},
        inverse_transform_{transform},
        raw_pixels_{source_pixels},
        mask_{(1U << info.bits_per_sample) - 1U}
    {
    }